

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void calc_similarity_internal<double,long,double>
               (double *numeric_data,int *categ_data,double *Xc,long *Xc_ind,long *Xc_indptr,
               size_t nrows,int nthreads,bool assume_full_distr,bool standardize_dist,bool as_kernel
               ,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,
               size_t n_from,bool use_indexed_references,TreesIndexer *indexer,bool is_col_major,
               size_t ld_numeric,size_t ld_categ)

{
  bool bVar1;
  runtime_error *prVar2;
  InputData<double,_long> *input_data;
  reference pvVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long *unaff_RBX;
  size_t unaff_RBP;
  long in_RSI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  long *unaff_R12;
  size_t unaff_R14;
  size_t unaff_R15;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  byte in_stack_00000010;
  byte in_stack_00000020;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_stack_00000028;
  ExtIsoForest *in_stack_00000030;
  long in_stack_00000038;
  SignalSwitcher *in_stack_00000040;
  long in_stack_00000048;
  byte in_stack_00000050;
  long in_stack_00000058;
  byte in_stack_00000060;
  ulong in_stack_00000068;
  ulong in_stack_00000070;
  size_t hplane;
  size_t tree;
  exception_ptr ex;
  size_t in_stack_00000148;
  bool threw_exception;
  SignalSwitcher ss;
  double *in_stack_00000160;
  vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> worker_memory;
  size_t lim_rows;
  size_t ntrees;
  PredictionData<double,_long> prediction_data;
  size_t in_stack_000001f0;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_000001f8;
  undefined3 in_stack_00000200;
  undefined4 uVar7;
  undefined1 in_stack_0000040f;
  size_t in_stack_00000410;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_stack_00000418;
  IsoForest *in_stack_00000420;
  PredictionData<double,_long> *in_stack_00000428;
  WorkerForSimilarity *in_stack_00000430;
  undefined1 in_stack_00000b75;
  undefined1 in_stack_00000b76;
  undefined1 in_stack_00000b77;
  size_t in_stack_00000b78;
  long *in_stack_00000b80;
  long *in_stack_00000b88;
  double *in_stack_00000b90;
  int *in_stack_00000b98;
  double *in_stack_00000ba0;
  int in_stack_00000be0;
  IsoForest *in_stack_00000bf8;
  ExtIsoForest *in_stack_00000c00;
  double *in_stack_00000c08;
  double *in_stack_00000c10;
  size_t in_stack_00000c18;
  TreesIndexer *in_stack_00000c20;
  size_t in_stack_00000c30;
  size_t in_stack_00000c38;
  exception_ptr *in_stack_fffffffffffffd98;
  SignalSwitcher *in_stack_fffffffffffffda0;
  SignalSwitcher *in_stack_fffffffffffffdb0;
  InputData<double,_long> *ss_00;
  size_type in_stack_fffffffffffffdb8;
  vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffe08;
  exception_ptr eVar8;
  reference in_stack_fffffffffffffe10;
  ExtIsoForest *in_stack_fffffffffffffe18;
  IsoForest *in_stack_fffffffffffffe20;
  PredictionData<double,_long> *in_stack_fffffffffffffe28;
  PredictionData<double,_long> *prediction_data_00;
  reference in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe48;
  ExtIsoForest *model_outputs_ext_00;
  IsoForest *in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  undefined4 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *in_stack_fffffffffffffe78;
  double *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  undefined1 local_150 [16];
  InputData<double,_long> *local_140;
  int in_stack_fffffffffffffec8;
  InputData<double,_long> *local_130;
  exception_ptr local_128;
  byte local_119;
  undefined1 local_101 [65];
  undefined1 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 in_stack_ffffffffffffff60;
  undefined2 uVar9;
  double *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  ExtIsoForest *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TreesIndexer *in_stack_ffffffffffffff90;
  
  uVar9 = (undefined2)((ulong)in_stack_ffffffffffffff60 >> 0x30);
  bVar6 = in_stack_00000020 & 1;
  bVar5 = in_stack_00000050 & 1;
  if (in_R9 < 2) {
    if (((bVar5 == 0) || (in_stack_00000058 == 0)) ||
       (bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                          ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                           in_stack_fffffffffffffdb0), bVar1)) {
LAB_00394a72:
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Cannot calculate distances from less than 2 rows.\n");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_fffffffffffffda0);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffdb0);
    if (bVar1) goto LAB_00394a72;
  }
  if (bVar6 != 0) {
    if ((in_stack_00000038 == 0) && (bVar5 != 0)) {
      if ((in_stack_00000058 != 0) &&
         (bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                            ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                             in_stack_fffffffffffffdb0), !bVar1)) {
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   in_stack_fffffffffffffda0);
        bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffdb0);
        if (bVar1) goto LAB_00394b33;
      }
    }
    else {
LAB_00394b33:
      in_stack_00000058 = 0;
    }
  }
  if ((in_stack_00000058 != 0) &&
     (in_stack_00000028 !=
      (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
       *)0x0)) {
    if ((*(int *)&in_stack_00000028[1].
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == 0x15) &&
       (in_stack_00000058 = 0, bVar5 != 0)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Invalid indexer - cannot use references from it.\n")
      ;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((((*(int *)&in_stack_00000028[1].
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0) &&
         (*(int *)((long)&in_stack_00000028[1].
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4) == 0)) && (in_RSI != 0)) &&
       (in_stack_00000058 = 0, bVar5 != 0)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Invalid indexer - cannot use references from it.\n")
      ;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((bVar6 == 0) && (in_stack_00000058 != 0)) {
    bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                      ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                       in_stack_fffffffffffffdb0);
    if (!bVar1) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffffda0);
      bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
      if (!bVar1) goto LAB_00394dbe;
    }
    if ((bVar5 != 0) &&
       (bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                          ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                           in_stack_fffffffffffffdb0), !bVar1)) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffffda0);
      bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffdb0);
      if (!bVar1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar2,"Indexer was built without distances. Cannot use references from it.\n");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    in_stack_00000058 = 0;
    fprintf(_stderr,"%s",
            "Indexer has no pre-computed distances, will not be used for distance calculations.\n");
  }
LAB_00394dbe:
  if ((((in_stack_00000060 & 1) == 0) && (in_stack_00000058 == 0)) &&
     ((in_R8 != 0 ||
      ((in_R9 != 1 &&
       (((in_RDI != 0 && (1 < in_stack_00000068)) || ((in_RSI != 0 && (1 < in_stack_00000070))))))))
     )) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"Cannot calculate distances with row-major data without indexer.\n");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_stack_00000058 != 0) {
    if (((bVar5 != 0) && (in_stack_00000038 == 0)) &&
       (bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                          ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                           in_stack_fffffffffffffdb0), !bVar1)) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_fffffffffffffda0);
      bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffdb0);
      if (!bVar1) {
        if (((in_stack_00000010 & 1 ^ 0xff) & 1) != 0) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar2,
                     "Cannot calculate distances to reference points in indexer with \'assume_full_distr=false\'.\n"
                    );
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (bVar6 == 0) {
          calc_similarity_from_indexer_with_references<double,long>
                    ((double *)
                     worker_memory.
                     super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int *)worker_memory.
                            super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>
                            ._M_impl.super__Vector_impl_data._M_start,in_stack_00000160,
                     (long *)ss._8_8_,(long *)ss.old_sig,in_stack_00000148,
                     (int)prediction_data.ncols_numeric,ex._M_exception_object._7_1_,
                     (IsoForest *)prediction_data.Xc,(ExtIsoForest *)prediction_data.Xc_ind,
                     (double *)prediction_data.Xc_indptr,(TreesIndexer *)prediction_data.Xr,
                     ex._M_exception_object._6_1_,
                     CONCAT17(prediction_data.Xr_indptr._7_1_,prediction_data.Xr_indptr._0_7_),
                     in_stack_000001f0);
          return;
        }
        kernel_to_references<double,long>
                  (in_stack_ffffffffffffff90,
                   (IsoForest *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68,unaff_RBX,unaff_R12,SUB21((ushort)uVar9 >> 8,0),
                   unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,
                   (double *)CONCAT44(in_stack_0000000c,in_stack_00000008),SUB21(uVar9,0));
        return;
      }
    }
    if (bVar6 == 0) {
      calc_similarity_from_indexer<double,long>
                (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90,in_stack_00000b88,
                 in_stack_00000b80,in_stack_00000b78,in_stack_00000be0,(bool)in_stack_00000b77,
                 (bool)in_stack_00000b76,in_stack_00000bf8,in_stack_00000c00,in_stack_00000c08,
                 in_stack_00000c10,in_stack_00000c18,in_stack_00000c20,(bool)in_stack_00000b75,
                 in_stack_00000c30,in_stack_00000c38);
      return;
    }
  }
  local_c0 = 0;
  local_b8 = 0;
  local_b0 = 0;
  if (in_stack_00000028 ==
      (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
       *)0x0) {
    input_data = (InputData<double,_long> *)
                 std::
                 vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ::size(&in_stack_00000030->hplanes);
  }
  else {
    input_data = (InputData<double,_long> *)
                 std::
                 vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ::size(in_stack_00000028);
  }
  if (in_stack_00000038 != 0) {
    in_stack_00000048 = 0;
  }
  local_101._33_8_ = input_data;
  if ((in_stack_00000048 == 0) && (local_101._25_8_ = 0xfffffffe, 0xfffffffe < in_R9)) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"Number of rows implies too large distance matrix (integer overflow).");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  model_outputs_ext_00 = (ExtIsoForest *)local_101;
  std::allocator<WorkerForSimilarity>::allocator((allocator<WorkerForSimilarity> *)0x3953fa);
  std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<WorkerForSimilarity>::~allocator((allocator<WorkerForSimilarity> *)0x395423);
  SignalSwitcher::SignalSwitcher(in_stack_fffffffffffffda0);
  check_interrupt_switch(in_stack_fffffffffffffdb0);
  local_119 = 0;
  std::__exception_ptr::exception_ptr::exception_ptr(&local_128,(nullptr_t)0x0);
  if (((in_stack_00000038 == 0) && (bVar5 != 0)) &&
     ((in_stack_00000058 != 0 &&
      (bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                         ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                          in_stack_fffffffffffffdb0), !bVar1)))) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_fffffffffffffda0);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffdb0);
    if (!bVar1) {
      if (bVar6 == 0) {
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   in_stack_fffffffffffffda0);
        bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
        if (bVar1) goto LAB_00395569;
      }
      pvVar3 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                         ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                          in_stack_fffffffffffffda0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar3->reference_points);
    }
  }
LAB_00395569:
  if (in_stack_00000028 ==
      (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
       *)0x0) {
    for (local_140 = (InputData<double,_long> *)0x0; local_140 < (ulong)local_101._33_8_;
        local_140 = (InputData<double,_long> *)((long)&local_140->numeric_data + 1)) {
      if (((local_119 & 1) == 0) && ((interrupt_switch & 1U) == 0)) {
        prediction_data_00 = (PredictionData<double,_long> *)0x0;
        std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[]
                  ((vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)
                   (local_101 + 1),0);
        initialize_worker_for_sim<PredictionData<double,long>>
                  (in_stack_fffffffffffffe30,prediction_data_00,in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
                   SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0));
        in_stack_fffffffffffffe20 = (IsoForest *)0x0;
        in_stack_fffffffffffffe10 =
             std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[]
                       ((vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)
                        (local_101 + 1),0);
        in_stack_fffffffffffffe18 = in_stack_00000030;
        std::
        vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ::operator[](&in_stack_00000030->hplanes,(size_type)local_140);
        traverse_hplane_sim<PredictionData<double,long>,double>
                  ((WorkerForSimilarity *)Xc_indptr,(PredictionData<double,_long> *)nrows,
                   (ExtIsoForest *)
                   CONCAT17(assume_full_distr,
                            CONCAT16(standardize_dist,
                                     CONCAT15(as_kernel,CONCAT14(use_indexed_references,uVar7)))),
                   in_stack_000001f8,in_stack_000001f0,prediction_data.Xr_indptr._7_1_);
      }
    }
  }
  else {
    for (local_130 = (InputData<double,_long> *)0x0; local_130 < (ulong)local_101._33_8_;
        local_130 = (InputData<double,_long> *)((long)&local_130->numeric_data + 1)) {
      if (((local_119 & 1) == 0) && ((interrupt_switch & 1U) == 0)) {
        in_stack_fffffffffffffe48 = 0;
        std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[]
                  ((vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)
                   (local_101 + 1),0);
        initialize_worker_for_sim<PredictionData<double,long>>
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
                   SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0));
        in_stack_fffffffffffffe30 =
             std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::operator[]
                       ((vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)
                        (local_101 + 1),0);
        std::
        vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ::operator[](in_stack_00000028,(size_type)local_130);
        traverse_tree_sim<PredictionData<double,long>,double>
                  (in_stack_00000430,in_stack_00000428,in_stack_00000420,in_stack_00000418,
                   in_stack_00000410,(bool)in_stack_0000040f);
      }
    }
  }
  check_interrupt_switch(in_stack_fffffffffffffdb0);
  if ((local_119 & 1) == 0) {
    ss_00 = (InputData<double,_long> *)local_101._33_8_;
    gather_sim_result<PredictionData<double,long>,InputData<double,long>,WorkerMemory<ImputedData<long,double>,double,double>>
              (in_stack_fffffffffffffe78,
               (vector<WorkerMemory<ImputedData<long,_double>,_double,_double>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_double>_>_>
                *)CONCAT17(in_stack_fffffffffffffe77,
                           CONCAT16(in_stack_fffffffffffffe76,
                                    CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
               (PredictionData<double,_long> *)
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),input_data,
               in_stack_fffffffffffffe58,model_outputs_ext_00,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
               SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffe48 >> 0x30,0),
               SUB81((ulong)in_stack_fffffffffffffe48 >> 0x28,0),in_stack_fffffffffffffec8);
    check_interrupt_switch((SignalSwitcher *)ss_00);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_00000040);
    SignalSwitcher::~SignalSwitcher(in_stack_00000040);
    std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::~vector
              ((vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)ss_00);
    return;
  }
  eVar8._M_exception_object = local_150;
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  uVar4 = std::rethrow_exception(eVar8);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_fffffffffffffda0);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_fffffffffffffda0);
  SignalSwitcher::~SignalSwitcher(in_stack_fffffffffffffda0);
  std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::~vector
            ((vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> *)
             in_stack_fffffffffffffdb0);
  _Unwind_Resume(uVar4);
}

Assistant:

void calc_similarity_internal(
                     real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    if (nrows < 2 && (!use_indexed_references || indexer == NULL || indexer->indices.empty() || indexer->indices.front().reference_points.empty()))
        throw std::runtime_error("Cannot calculate distances from less than 2 rows.\n");
    if (as_kernel && (tmat != NULL || !use_indexed_references || (indexer != NULL && !indexer->indices.empty() && indexer->indices.front().reference_points.empty())))
        indexer = NULL;

    if (indexer != NULL && model_outputs != NULL)
    {
        if (model_outputs->missing_action == Divide) {
            indexer = NULL;
            if (use_indexed_references) throw std::runtime_error("Invalid indexer - cannot use references from it.\n");
        }
        if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL) {
            indexer = NULL;
            if (use_indexed_references) throw std::runtime_error("Invalid indexer - cannot use references from it.\n");
        }
    }
    if (
        !as_kernel &&
        indexer != NULL &&
        (indexer->indices.empty() || indexer->indices.front().node_distances.empty())
    ) {
        if (use_indexed_references && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty())
            throw std::runtime_error("Indexer was built without distances. Cannot use references from it.\n");
        else {
            indexer = NULL;
            print_errmsg("Indexer has no pre-computed distances, will not be used for distance calculations.\n");
        }
    }
    if (
        !is_col_major &&
        indexer == NULL &&
        (
            Xc_indptr != NULL
                ||
            (nrows != 1 &&
             ((numeric_data != NULL && ld_numeric > 1) || (categ_data != NULL && ld_categ > 1)))
        )
    )
        throw std::runtime_error("Cannot calculate distances with row-major data without indexer.\n");
    if (indexer != NULL)
    {
        if (use_indexed_references && tmat == NULL && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty())
        {
            if (unlikely(!assume_full_distr))
                throw std::runtime_error("Cannot calculate distances to reference points in indexer with 'assume_full_distr=false'.\n");
            
            if (!as_kernel)
            {
                calc_similarity_from_indexer_with_references(
                    numeric_data, categ_data,
                    Xc, Xc_ind, Xc_indptr,
                    nrows, nthreads, standardize_dist,
                    model_outputs, model_outputs_ext,
                    rmat,
                    indexer, is_col_major, ld_numeric, ld_categ
                );
            }
            
            else
            {
                kernel_to_references(*indexer,
                                     model_outputs, model_outputs_ext,
                                     numeric_data, categ_data,
                                     Xc, Xc_ind, Xc_indptr,
                                     is_col_major, ld_numeric, ld_categ,
                                     nrows, nthreads,
                                     rmat,
                                     standardize_dist);
            }
        }

        else
        {
            if (as_kernel) goto skip_indexer_if_kernel;
            calc_similarity_from_indexer(
                numeric_data, categ_data,
                Xc, Xc_ind, Xc_indptr,
                nrows, nthreads, assume_full_distr, standardize_dist,
                model_outputs, model_outputs_ext,
                tmat, rmat, n_from,
                indexer, is_col_major, ld_numeric, ld_categ
            );
        }

        return;
    }
    skip_indexer_if_kernel:

    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      false, 0, 0,
                                      Xc, Xc_ind, Xc_indptr,
                                      NULL, NULL, NULL};

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();

    if (tmat != NULL) n_from = 0;

    if (n_from == 0) {
        #if SIZE_MAX == UINT32_MAX
        size_t lim_rows = (size_t)UINT16_MAX - (size_t)1;
        #elif SIZE_MAX == UINT64_MAX
        size_t lim_rows = (size_t)UINT32_MAX - (size_t)1;
        #else
        size_t lim_rows = (size_t)std::ceil(std::sqrt((ldouble_safe)SIZE_MAX));
        #endif
        if (nrows > lim_rows)
            throw std::runtime_error("Number of rows implies too large distance matrix (integer overflow).");
    }

    if ((size_t)nthreads > ntrees)
        nthreads = (int)ntrees;
    #ifdef _OPENMP
    std::vector<WorkerForSimilarity> worker_memory(nthreads);
    #else
    std::vector<WorkerForSimilarity> worker_memory(1);
    nthreads = 1;
    #endif

    /* Global variable that determines if the procedure receives a stop signal */
    SignalSwitcher ss = SignalSwitcher();
    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif
    /* For handling exceptions */
    bool threw_exception = false;
    std::exception_ptr ex = NULL;

    if (
        tmat == NULL &&
        use_indexed_references &&
        indexer != NULL &&
        !indexer->indices.empty() &&
        !indexer->indices.front().reference_points.empty() &&
        (as_kernel || !indexer->indices.front().node_distances.empty())
    ) {
        n_from = indexer->indices.front().reference_points.size();
    }

    if (model_outputs != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(ntrees, worker_memory, prediction_data, model_outputs, ex, threw_exception, n_from)
        for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
        {
            if (threw_exception || interrupt_switch) continue;
            try
            {
                initialize_worker_for_sim(worker_memory[omp_get_thread_num()], prediction_data,
                                          model_outputs, NULL, n_from, assume_full_distr);
                traverse_tree_sim<PredictionData<real_t, sparse_ix>, ldouble_safe>(
                                  worker_memory[omp_get_thread_num()],
                                  prediction_data,
                                  *model_outputs,
                                  model_outputs->trees[tree],
                                  (size_t)0,
                                  as_kernel);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }
        }
    }

    else
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(ntrees, worker_memory, prediction_data, model_outputs_ext, ex, threw_exception, n_from)
        for (size_t_for hplane = 0; hplane < (decltype(hplane))ntrees; hplane++)
        {
            if (threw_exception || interrupt_switch) continue;
            try
            {
                initialize_worker_for_sim(worker_memory[omp_get_thread_num()], prediction_data,
                                          NULL, model_outputs_ext, n_from, assume_full_distr);
                traverse_hplane_sim<PredictionData<real_t, sparse_ix>, ldouble_safe>(
                                    worker_memory[omp_get_thread_num()],
                                    prediction_data,
                                    *model_outputs_ext,
                                    model_outputs_ext->hplanes[hplane],
                                    (size_t)0,
                                    as_kernel);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }
        }    
    }

    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif

    if (threw_exception)
        std::rethrow_exception(ex);
    
    /* gather and transform the results */
    gather_sim_result< PredictionData<real_t, sparse_ix>,
                       InputData<real_t, sparse_ix>,
                       WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t> >
                     (&worker_memory, NULL,
                      &prediction_data, NULL,
                      model_outputs, model_outputs_ext,
                      tmat, rmat, n_from,
                      ntrees, assume_full_distr,
                      standardize_dist, as_kernel, nthreads);

    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif
}